

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_>::Data
          (Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_> *this,
          Data<QHashPrivate::Node<QStyle::SubControl,_QRect>_> *other)

{
  Entry *pEVar1;
  Span *pSVar2;
  Entry *pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  Node<QStyle::SubControl,_QRect> *pNVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  R RVar11;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar9 = other->numBuckets;
  sVar10 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar10;
  this->spans = (Span *)0x0;
  RVar11 = allocateSpans(sVar9);
  this->spans = (Span *)RVar11.spans;
  if (RVar11.nSpans != 0) {
    lVar8 = 0;
    sVar9 = 0;
    do {
      pSVar2 = other->spans;
      sVar10 = 0;
      do {
        uVar6 = (ulong)pSVar2->offsets[sVar10 + lVar8];
        if (uVar6 != 0xff) {
          pEVar3 = pSVar2[sVar9].entries;
          pNVar7 = Span<QHashPrivate::Node<QStyle::SubControl,_QRect>_>::insert
                             (this->spans + sVar9,sVar10);
          pEVar1 = pEVar3 + uVar6;
          uVar4 = *(undefined8 *)(pEVar1->storage).data;
          uVar5 = *(undefined8 *)((pEVar1->storage).data + 8);
          pNVar7->key = (int)uVar4;
          (pNVar7->value).x1 = (Representation)(int)((ulong)uVar4 >> 0x20);
          (pNVar7->value).y1 = (Representation)(int)uVar5;
          (pNVar7->value).x2 = (Representation)(int)((ulong)uVar5 >> 0x20);
          (pNVar7->value).y2.m_i = *(int *)(pEVar3[uVar6].storage.data + 0x10);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != 0x80);
      sVar9 = sVar9 + 1;
      lVar8 = lVar8 + 0x90;
    } while (sVar9 != RVar11.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }